

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O0

u32 u32Deshuffle(u32 w)

{
  uint uVar1;
  uint uVar2;
  u32 t;
  u32 w_local;
  
  uVar1 = (w ^ w >> 1) & 0x22222222;
  uVar2 = uVar1 ^ uVar1 << 1 ^ w;
  uVar1 = (uVar2 ^ uVar2 >> 2) & 0xc0c0c0c;
  uVar2 = uVar1 ^ uVar1 << 2 ^ uVar2;
  uVar1 = (uVar2 ^ uVar2 >> 4) & 0xf000f0;
  uVar2 = uVar1 ^ uVar1 << 4 ^ uVar2;
  uVar1 = (uVar2 ^ uVar2 >> 8) & 0xff00;
  return uVar1 ^ uVar1 << 8 ^ uVar2;
}

Assistant:

u32 u32Deshuffle(register u32 w)
{
	register u32 t;
	t = (w ^ (w >> 1)) & 0x22222222, w ^= t ^ (t << 1);
	t = (w ^ (w >> 2)) & 0x0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 4)) & 0x00F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 8)) & 0x0000FF00, w ^= t ^ (t << 8);
	t = 0;
	return w;
}